

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O2

void __thiscall
MinVR::
VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
::VRDatumSpecialized
          (VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *inVal)

{
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  
  VRDatum::VRDatum(&this->super_VRDatum,VRCORETYPE_STRING);
  (this->super_VRDatum)._vptr_VRDatum = (_func_int **)&PTR__VRDatumSpecialized_0015cd18;
  this_00 = &this->value;
  (this->value).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->value).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->value).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this->needPush = false;
  this->pushed = false;
  this->stackFrame = 1;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_front(this_00,inVal);
  return;
}

Assistant:

VRDatumSpecialized(const T inVal):
    VRDatum(TID), needPush(false), pushed(false), stackFrame(1) {
    value.push_front(inVal);
  }